

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

KindedSources * __thiscall
cmGeneratorTarget::GetKindedSources(cmGeneratorTarget *this,string *config)

{
  cmake *this_00;
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  string *psVar4;
  KindedSources *files;
  undefined1 auStack_1e8 [16];
  string local_1d8;
  string key;
  ostringstream e;
  
  if (this->SourcesAreContextDependent == False) {
    files = (KindedSources *)
            ((this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  }
  else {
    cmsys::SystemTools::UpperCase(&key,config);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
            ::find(&(this->KindedSourcesMap)._M_t,&key);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header) {
      files = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
              ::operator[](&this->KindedSourcesMap,&key);
      ComputeKindedSources(this,files,config);
      *(undefined1 *)&((_Base_ptr)files)->_M_right = 1;
    }
    else if (*(char *)&iVar2._M_node[2]._M_right == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,"The SOURCES of \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"\" use a generator expression that depends on the SOURCES themselves."
                     );
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)auStack_1e8);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(auStack_1e8 + 0x10),
                          (cmListFileBacktrace *)auStack_1e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8));
      std::__cxx11::string::~string((string *)(auStack_1e8 + 0x10));
      if (GetKindedSources(std::__cxx11::string_const&)::empty == '\0') {
        iVar1 = __cxa_guard_acquire(&GetKindedSources(std::__cxx11::string_const&)::empty);
        if (iVar1 != 0) {
          GetKindedSources::empty.Sources.
          super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          GetKindedSources::empty._17_8_ = 0;
          GetKindedSources::empty.Sources.
          super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          GetKindedSources::empty.Sources.
          super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          GetKindedSources::empty.Sources.
          super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          __cxa_atexit(KindedSources::~KindedSources,&GetKindedSources::empty,&__dso_handle);
          __cxa_guard_release(&GetKindedSources(std::__cxx11::string_const&)::empty);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      files = &GetKindedSources::empty;
    }
    else {
      files = (KindedSources *)(iVar2._M_node + 2);
    }
    std::__cxx11::string::~string((string *)&key);
  }
  return (KindedSources *)(_Base_ptr)files;
}

Assistant:

cmGeneratorTarget::KindedSources const& cmGeneratorTarget::GetKindedSources(
  std::string const& config) const
{
  // If we already processed one configuration and found no dependency
  // on configuration then always use the one result.
  if (this->SourcesAreContextDependent == Tribool::False) {
    return this->KindedSourcesMap.begin()->second;
  }

  // Lookup any existing link implementation for this configuration.
  std::string const key = cmSystemTools::UpperCase(config);
  auto it = this->KindedSourcesMap.find(key);
  if (it != this->KindedSourcesMap.end()) {
    if (!it->second.Initialized) {
      std::ostringstream e;
      e << "The SOURCES of \"" << this->GetName()
        << "\" use a generator expression that depends on the "
           "SOURCES themselves.";
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
      static KindedSources empty;
      return empty;
    }
    return it->second;
  }

  // Add an entry to the map for this configuration.
  KindedSources& files = this->KindedSourcesMap[key];
  this->ComputeKindedSources(files, config);
  files.Initialized = true;
  return files;
}